

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QToolBox::indexOf(QToolBox *this,QWidget *widget)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  
  lVar7 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (widget != (QWidget *)0x0) {
    for (plVar4 = *(long **)(lVar7 + 0x278); plVar4 != *(long **)(lVar7 + 0x280);
        plVar4 = plVar4 + 1) {
      lVar3 = *plVar4;
      if (*(QWidget **)(lVar3 + 0x10) == widget) goto LAB_004c08d0;
    }
  }
  lVar3 = 0;
LAB_004c08d0:
  if (lVar3 == 0) {
    return -1;
  }
  plVar4 = *(long **)(lVar7 + 0x278);
  plVar1 = *(long **)(lVar7 + 0x280);
  lVar7 = (long)plVar1 - (long)plVar4 >> 5;
  plVar5 = plVar4;
  if (0 < lVar7) {
    plVar5 = (long *)(((long)plVar1 - (long)plVar4 & 0xffffffffffffffe0U) + (long)plVar4);
    lVar7 = lVar7 + 1;
    plVar6 = plVar4 + 2;
    do {
      if (plVar6[-2] == lVar3) {
        plVar6 = plVar6 + -2;
        goto LAB_004c0984;
      }
      if (plVar6[-1] == lVar3) {
        plVar6 = plVar6 + -1;
        goto LAB_004c0984;
      }
      if (*plVar6 == lVar3) goto LAB_004c0984;
      if (plVar6[1] == lVar3) {
        plVar6 = plVar6 + 1;
        goto LAB_004c0984;
      }
      lVar7 = lVar7 + -1;
      plVar6 = plVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)plVar1 - (long)plVar5 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      plVar6 = plVar1;
      if ((lVar7 != 3) || (plVar6 = plVar5, *plVar5 == lVar3)) goto LAB_004c0984;
      plVar5 = plVar5 + 1;
    }
    plVar6 = plVar5;
    if (*plVar5 == lVar3) goto LAB_004c0984;
    plVar5 = plVar5 + 1;
  }
  plVar6 = plVar5;
  if (*plVar5 != lVar3) {
    plVar6 = plVar1;
  }
LAB_004c0984:
  iVar2 = -1;
  if (plVar6 != plVar1) {
    iVar2 = (int)((ulong)((long)plVar6 - (long)plVar4) >> 3);
  }
  return iVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }